

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

void __thiscall kj::anon_unknown_36::HttpOutputStream::~HttpOutputStream(HttpOutputStream *this)

{
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&this->writeQueue);
  WrappableStreamMixin<kj::(anonymous_namespace)::HttpOutputStream>::~WrappableStreamMixin
            (&this->super_WrappableStreamMixin<kj::(anonymous_namespace)::HttpOutputStream>);
  return;
}

Assistant:

HttpOutputStream(AsyncOutputStream& inner): inner(inner) {}